

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sar.c
# Opt level: O0

ErrorNumber test_func_sar(TA_History *history)

{
  ErrorNumber EVar1;
  uint *in_RDI;
  ErrorNumber retValue;
  uint i;
  TA_Test_conflict13 *in_stack_00000020;
  TA_History *in_stack_00000028;
  uint local_14;
  
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0x7c);
  local_14 = 0;
  while( true ) {
    if (4 < local_14) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
    if ((int)*in_RDI < tableTest[local_14].expectedNbElement) break;
    EVar1 = do_test(in_stack_00000028,in_stack_00000020);
    if (EVar1 != TA_TEST_PASS) {
      printf("%s Failed Test #%d (Code=%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_sar.c"
             ,(ulong)local_14,(ulong)EVar1);
      return EVar1;
    }
    local_14 = local_14 + 1;
  }
  printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_sar.c"
         ,(ulong)local_14,(ulong)(uint)tableTest[local_14].expectedNbElement,(ulong)*in_RDI);
  return TA_TESTUTIL_TFRR_BAD_PARAM;
}

Assistant:

ErrorNumber test_func_sar( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Set all the unstable period to a weird value. This is to make sure
    * that no unstable period affects the SAR.
    */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 124 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}